

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O0

int run_test_tcp_create_early_accept(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  undefined1 local_258 [8];
  uv_connect_t connect_req;
  uv_tcp_t server;
  uv_tcp_t client;
  
  puVar2 = (uv_loop_t *)uv_default_loop();
  tcp_listener(puVar2,(uv_tcp_t *)(connect_req.queue + 1));
  puVar2 = (uv_loop_t *)uv_default_loop();
  tcp_connector(puVar2,(uv_tcp_t *)&server.queued_fds,(uv_connect_t *)local_258);
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  puVar2 = (uv_loop_t *)uv_default_loop();
  close_loop(puVar2);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0xcf,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_create_early_accept) {
  uv_tcp_t client, server;
  uv_connect_t connect_req;

  tcp_listener(uv_default_loop(), &server);
  tcp_connector(uv_default_loop(), &client, &connect_req);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}